

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O2

Pair<char32_t,_unsigned_long> __thiscall
Corrade::Utility::Unicode::nextChar(Unicode *this,StringView text,size_t cursor)

{
  uint uVar1;
  byte *pbVar2;
  ostream *output;
  Debug *pDVar3;
  ulong value;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  Pair<char32_t,_unsigned_long> PVar7;
  long lStack_70;
  StringView text_local;
  Error local_58;
  
  value = text._sizePlusFlags;
  text_local._sizePlusFlags = (size_t)text._data;
  uVar6 = text_local._sizePlusFlags & 0x3fffffffffffffff;
  text_local._data = (char *)this;
  if (uVar6 <= value) {
    output = Error::defaultOutput();
    Error::Error(&local_58,output,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_58.super_Debug,
                               "Utility::Unicode::nextChar(): expected cursor to be less than");
    pDVar3 = Debug::operator<<(pDVar3,uVar6);
    pDVar3 = Debug::operator<<(pDVar3,"but got");
    Debug::operator<<(pDVar3,value);
    Error::~Error(&local_58);
    abort();
  }
  pbVar2 = (byte *)Containers::BasicStringView<const_char>::operator[](&text_local,value);
  uVar1 = (uint)*pbVar2;
  if ((char)*pbVar2 < '\0') {
    if ((uVar1 & 0xffffffe0) == 0xc0) {
      uVar4 = 0x1f;
      lStack_70 = 2;
      goto LAB_0013dcc0;
    }
    if ((uVar1 & 0xfffffff0) == 0xe0) {
      uVar4 = 0xf;
      lStack_70 = 3;
      goto LAB_0013dcc0;
    }
    if ((uVar1 & 0xfffffff8) == 0xf0) {
      uVar4 = 7;
      lStack_70 = 4;
      goto LAB_0013dcc0;
    }
  }
  else {
    uVar4 = 0x7f;
    lStack_70 = 1;
LAB_0013dcc0:
    uVar6 = value + lStack_70;
    if (uVar6 <= (text_local._sizePlusFlags & 0x3fffffffffffffff)) {
      uVar5 = (ulong)(uVar4 & uVar1);
      if (lStack_70 == 1) goto LAB_0013dcd9;
      Containers::BasicStringView<const_char>::operator[](&text_local,value + 1);
    }
  }
  uVar6 = value + 1;
  uVar5 = 0xffffffffffffffff;
LAB_0013dcd9:
  PVar7._0_8_ = uVar5 & 0xffffffff;
  PVar7._second = uVar6;
  return PVar7;
}

Assistant:

Containers::Pair<char32_t, std::size_t> nextChar(const Containers::StringView text, const std::size_t cursor) {
    CORRADE_DEBUG_ASSERT(cursor < text.size(),
        "Utility::Unicode::nextChar(): expected cursor to be less than" << text.size() << "but got" << cursor, {});

    std::uint32_t character = text[cursor];
    std::size_t end = cursor;
    std::uint32_t mask;

    /** @todo assert for overlong sequences */

    /* Sequence size */
    if(character < 0x80) {
        end += 1;
        mask = 0x7f;
    } else if((character & 0xe0) == 0xc0) {
        end += 2;
        mask = 0x1f;
    } else if((character & 0xf0) == 0xe0) {
        end += 3;
        mask = 0x0f;
    } else if((character & 0xf8) == 0xf0) {
        end += 4;
        mask = 0x07;

    /* Wrong sequence start */
    } else return {U'\xffffffff', cursor+1};

    /* Unexpected end */
    if(text.size() < end) return {U'\xffffffff', cursor+1};

    /* Compute the codepoint */
    char32_t result = character & mask;
    for(std::size_t i = cursor + 1; i != end; ++i) {
        /* Garbage in the sequence */
        if((text[i] & 0xc0) != 0x80)
            return {U'\xffffffff', cursor+1};

        result <<= 6;
        result |= (text[i] & 0x3f);
    }

    return {result, end};
}